

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamodel.cpp
# Opt level: O1

void __thiscall FSSDataModel::saveSetting(FSSDataModel *this,PSource *source)

{
  int *piVar1;
  DataSourceType DVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QSettings settings;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  anon_union_24_3_e3d07ef4_for_data local_70;
  long *local_50 [2];
  long local_40 [2];
  QSettings local_30 [16];
  PSource local_20;
  
  QSettings::QSettings(local_30,(QObject *)0x0);
  local_20.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (source->super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_20.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (source->super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_20.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_20.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_20.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  DVar2 = getType(&local_20);
  if (local_20.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (DVar2 == DataSourceTypeDos) {
    QVar4.m_data = (storage_type *)0xb;
    QVar4.m_size = (qsizetype)&local_70;
    QString::fromUtf8(QVar4);
    local_88 = local_70._0_4_;
    uStack_84 = local_70._4_4_;
    uStack_80 = local_70._8_4_;
    uStack_7c = local_70._12_4_;
    local_78 = local_70._16_8_;
    (*((source->super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Source
      [1])(local_50);
    QVariant::QVariant((QVariant *)&local_70,(char *)local_50[0]);
    QSettings::setValue((QString *)local_30,(QVariant *)&local_88);
  }
  else if (DVar2 == DataSourceTypeAmiga) {
    QVar3.m_data = (storage_type *)0xd;
    QVar3.m_size = (qsizetype)&local_70;
    QString::fromUtf8(QVar3);
    local_88 = local_70._0_4_;
    uStack_84 = local_70._4_4_;
    uStack_80 = local_70._8_4_;
    uStack_7c = local_70._12_4_;
    local_78 = local_70._16_8_;
    (*((source->super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Source
      [1])(local_50);
    QVariant::QVariant((QVariant *)&local_70,(char *)local_50[0]);
    QSettings::setValue((QString *)local_30,(QVariant *)&local_88);
  }
  else {
    QVar5.m_data = (storage_type *)0xe;
    QVar5.m_size = (qsizetype)&local_70;
    QString::fromUtf8(QVar5);
    local_88 = local_70._0_4_;
    uStack_84 = local_70._4_4_;
    uStack_80 = local_70._8_4_;
    uStack_7c = local_70._12_4_;
    local_78 = local_70._16_8_;
    (*((source->super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Source
      [1])(local_50);
    QVariant::QVariant((QVariant *)&local_70,(char *)local_50[0]);
    QSettings::setValue((QString *)local_30,(QVariant *)&local_88);
  }
  QVariant::~QVariant((QVariant *)&local_70);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  piVar1 = (int *)CONCAT44(uStack_84,local_88);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_84,local_88),2,8);
    }
  }
  QSettings::sync();
  QSettings::~QSettings(local_30);
  return;
}

Assistant:

void
FSSDataModel::saveSetting(Data::PSource source) {
  QSettings settings;
  switch (getType(source)) {
    case DataSourceTypeDos:
      settings.setValue("sources/dos", source->get_path().c_str());
      break;
    case DataSourceTypeAmiga:
      settings.setValue("sources/amiga", source->get_path().c_str());
      break;
    case DataSourceTypeCustom:
      settings.setValue("sources/custom", source->get_path().c_str());
      break;
  }
  settings.sync();
}